

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool __thiscall cppcms::xss::uri_parser::unreserved(uri_parser *this)

{
  char c_00;
  bool bVar1;
  long in_RDI;
  char c;
  bool local_1;
  
  if (*(long *)(in_RDI + 0x10) == *(long *)(in_RDI + 0x18)) {
    local_1 = false;
  }
  else {
    c_00 = **(char **)(in_RDI + 0x10);
    bVar1 = is_alapha(c_00);
    if ((((!bVar1) && (bVar1 = is_digit(c_00), !bVar1)) && (c_00 != '-')) &&
       (((c_00 != '.' && (c_00 != '_')) && (c_00 != '~')))) {
      return false;
    }
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool unreserved()
		{
			if(begin_ == end_)
				return false;
			char c=*begin_;
			if(	is_alapha(c) || is_digit(c) 
				|| c=='-' || c=='.' || c=='_' || c=='~')
			{
				begin_++;
				return true;
			}
			return false;
		}